

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

RABlock * __thiscall
asmjit::v1_14::BaseRAPass::newBlockOrExistingAt
          (BaseRAPass *this,LabelNode *cbLabel,BaseNode **stoppedAt)

{
  Error EVar1;
  uint uVar2;
  RABlock *pRVar3;
  undefined4 extraout_var;
  uint uVar4;
  FuncNode *pFVar5;
  LabelNode *pLVar6;
  FuncNode *pFVar7;
  long lVar8;
  
  pRVar3 = *(RABlock **)(cbLabel + 0x20);
  if (pRVar3 == (RABlock *)0x0) {
    pFVar5 = *(FuncNode **)cbLabel;
    if (pFVar5 == (FuncNode *)0x0) {
      lVar8 = 0;
      pFVar5 = (FuncNode *)0x0;
      pRVar3 = (RABlock *)0x0;
    }
    else {
      pFVar7 = this->_func;
      lVar8 = 0;
      do {
        pRVar3 = (RABlock *)0x0;
        if (pFVar5->field_0x10 != '\x04') {
          if (pFVar5->field_0x10 != '\x03') goto LAB_00126c6a;
          if (pFVar5 == pFVar7) {
            newBlockOrExistingAt();
            uVar2 = *(uint *)&this->field_0xb8;
            uVar4 = *(uint *)&this->field_0xbc;
            if (uVar4 == uVar2) {
              EVar1 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_blocks,&this->_allocator,8,1);
              if (EVar1 != 0) {
                return (RABlock *)CONCAT44(extraout_var,EVar1);
              }
              uVar2 = *(uint *)&this->field_0xb8;
              uVar4 = *(uint *)&this->field_0xbc;
            }
            *(uint *)&pFVar7->field_0x8 = uVar2;
            if (uVar2 < uVar4) {
              *(FuncNode **)(*(long *)&this->_blocks + (ulong)uVar2 * 8) = pFVar7;
              *(int *)&this->field_0xb8 = *(int *)&this->field_0xb8 + 1;
              return (RABlock *)0x0;
            }
            addBlock();
            return (RABlock *)0x3;
          }
          if (*(RABlock **)&pFVar5->field_0x20 != (RABlock *)0x0) {
            pRVar3 = *(RABlock **)&pFVar5->field_0x20;
            if (pFVar5 == (FuncNode *)pFVar7->_exitNode) {
              pRVar3 = (RABlock *)0x0;
            }
            goto LAB_00126c6a;
          }
          lVar8 = lVar8 + 1;
        }
        pFVar5 = *(FuncNode **)pFVar5;
      } while (pFVar5 != (FuncNode *)0x0);
      pFVar5 = (FuncNode *)0x0;
    }
LAB_00126c6a:
    if (stoppedAt != (BaseNode **)0x0) {
      *stoppedAt = (BaseNode *)pFVar5;
    }
    if (pRVar3 == (RABlock *)0x0) goto LAB_00126cc2;
    while (*(RABlock **)(cbLabel + 0x20) = pRVar3, pLVar6 = cbLabel, lVar8 != 0) {
LAB_00126c86:
      pLVar6 = *(LabelNode **)pLVar6;
      do {
        if (pLVar6[0x10] == (LabelNode)0x3) goto LAB_00126c99;
        pLVar6 = *(LabelNode **)pLVar6;
      } while (pLVar6 != (LabelNode *)0x0);
      newBlockOrExistingAt();
LAB_00126cc2:
      pRVar3 = newBlock(this,(BaseNode *)0x0);
      if (pRVar3 == (RABlock *)0x0) {
        return (RABlock *)0x0;
      }
    }
LAB_00126ca2:
    if (*(long *)(pRVar3 + 0x10) == 0) {
      *(LabelNode **)(pRVar3 + 0x10) = pLVar6;
      *(LabelNode **)(pRVar3 + 0x18) = cbLabel;
    }
  }
  return pRVar3;
LAB_00126c99:
  *(RABlock **)(pLVar6 + 0x20) = pRVar3;
  lVar8 = lVar8 + -1;
  if (lVar8 == 0) goto LAB_00126ca2;
  goto LAB_00126c86;
}

Assistant:

RABlock* BaseRAPass::newBlockOrExistingAt(LabelNode* cbLabel, BaseNode** stoppedAt) noexcept {
  if (cbLabel->hasPassData())
    return cbLabel->passData<RABlock>();

  FuncNode* func = this->func();
  BaseNode* node = cbLabel->prev();
  RABlock* block = nullptr;

  // Try to find some label, but terminate the loop on any code. We try hard to coalesce code that contains two
  // consecutive labels or a combination of non-code nodes between 2 or more labels.
  //
  // Possible cases that would share the same basic block:
  //
  //   1. Two or more consecutive labels:
  //     Label1:
  //     Label2:
  //
  //   2. Two or more labels separated by non-code nodes:
  //     Label1:
  //     ; Some comment...
  //     .align 16
  //     Label2:
  size_t nPendingLabels = 0;

  while (node) {
    if (node->type() == NodeType::kLabel) {
      // Function has a different NodeType, just make sure this was not messed up as we must never associate
      // BasicBlock with a `func` itself.
      ASMJIT_ASSERT(node != func);

      block = node->passData<RABlock>();
      if (block) {
        // Exit node has always a block associated with it. If we went here it means that `cbLabel` passed here
        // is after the end of the function and cannot be merged with the function exit block.
        if (node == func->exitNode())
          block = nullptr;
        break;
      }

      nPendingLabels++;
    }
    else if (node->type() == NodeType::kAlign) {
      // Align node is fine.
    }
    else {
      break;
    }

    node = node->prev();
  }

  if (stoppedAt)
    *stoppedAt = node;

  if (!block) {
    block = newBlock();
    if (ASMJIT_UNLIKELY(!block))
      return nullptr;
  }

  cbLabel->setPassData<RABlock>(block);
  node = cbLabel;

  while (nPendingLabels) {
    node = node->prev();
    for (;;) {
      if (node->type() == NodeType::kLabel) {
        node->setPassData<RABlock>(block);
        nPendingLabels--;
        break;
      }

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }
  }

  if (!block->first()) {
    block->setFirst(node);
    block->setLast(cbLabel);
  }

  return block;
}